

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

PaddingResult __thiscall QTextStreamPrivate::padding(QTextStreamPrivate *this,qsizetype len)

{
  FieldAlignment FVar1;
  undefined1 auVar2 [16];
  PaddingResult PVar3;
  PaddingResult PVar4;
  
  FVar1 = (this->params).fieldAlignment;
  if (FVar1 < 4) {
    PVar3.left = (this->params).fieldWidth - len;
    switch(FVar1) {
    case AlignLeft:
      break;
    default:
      PVar3.right = 0;
      return PVar3;
    case AlignCenter:
      PVar4.right = PVar3.left - (long)PVar3.left / 2;
      PVar4.left = (long)PVar3.left / 2;
      return PVar4;
    }
  }
  else {
    PVar3.left = 0;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = PVar3.left;
  return (PaddingResult)(auVar2 << 0x40);
}

Assistant:

QTextStreamPrivate::PaddingResult QTextStreamPrivate::padding(qsizetype len) const
{
    Q_ASSERT(params.fieldWidth > len); // calling padding() when no padding is needed is an error

    qsizetype left = 0, right = 0;

    const qsizetype padSize = params.fieldWidth - len;

    switch (params.fieldAlignment) {
    case QTextStream::AlignLeft:
        right = padSize;
        break;
    case QTextStream::AlignRight:
    case QTextStream::AlignAccountingStyle:
        left  = padSize;
        break;
    case QTextStream::AlignCenter:
        left  = padSize/2;
        right = padSize - padSize/2;
        break;
    }
    return { left, right };
}